

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O2

Vector<float,_3,_true> __thiscall
Nova::Vector<float,_3,_true>::operator+(Vector<float,_3,_true> *this,Vector<float,_3,_true> *a)

{
  Vector<float,_3,_true> *in_RDX;
  undefined8 extraout_XMM0_Qa;
  float in_XMM1_Da;
  Vector<float,_3,_true> VVar1;
  
  Vector(this,a);
  operator+=(this,in_RDX);
  VVar1._data._M_elems[2] = in_XMM1_Da;
  VVar1._data._M_elems[0] = (float)(int)extraout_XMM0_Qa;
  VVar1._data._M_elems[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vector<float,_3,_true>)VVar1._data._M_elems;
}

Assistant:

Vector operator+(const Vector& a) const
    {
        Vector data_copy(*this);
        data_copy+=a;
        return data_copy;
    }